

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_seq_blck(Parser *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  csubstr s_00;
  csubstr val;
  bool bVar10;
  undefined1 uVar11;
  char cVar12;
  int iVar13;
  size_t sVar14;
  State *pSVar15;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  byte bVar20;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr chars_01;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  ro_substr pattern_04;
  csubstr fmt;
  ro_substr pattern_05;
  ro_substr pattern_06;
  ro_substr chars_02;
  ro_substr pattern_07;
  csubstr cVar21;
  size_t sStackY_1d0;
  bool is_quoted;
  basic_substring<const_char> local_198;
  char msg [30];
  csubstr s;
  size_t local_118;
  size_t local_e8;
  size_t local_c0;
  size_t local_98;
  size_t local_70;
  size_t local_48;
  basic_substring<const_char> local_40;
  basic_substring<const_char> local_30;
  
  bVar20 = 0;
  pSVar15 = this->m_state;
  local_198.str = (pSVar15->line_contents).rem.str;
  local_198.len = (pSVar15->line_contents).rem.len;
  uVar16 = pSVar15->flags;
  if ((uVar16 & 8) == 0) {
    builtin_strncpy(msg,"check failed: (has_all(RSEQ))",0x1e);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar2 = (code *)swi(3);
      uVar11 = (*pcVar2)();
      return (bool)uVar11;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar21 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_48 = cVar21.len;
    auVar4 = ZEXT1224(ZEXT412(0x6e2d) << 0x40);
    LVar3.name.str._0_4_ = (int)cVar21.str;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = cVar21.str._4_4_;
    LVar3.name.len = local_48;
    (*p_Var1)(msg,0x1e,LVar3,(this->m_stack).m_callbacks.m_user_data);
    uVar16 = this->m_state->flags;
  }
  if ((uVar16 & 0x40) != 0) {
    builtin_strncpy(msg,"check failed: (has_none(RKEY))",0x1e);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar2 = (code *)swi(3);
      uVar11 = (*pcVar2)();
      return (bool)uVar11;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar21 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar21.len;
    auVar4 = ZEXT1224(ZEXT412(0x6e2e) << 0x40);
    LVar5.name.str._0_4_ = (int)cVar21.str;
    LVar5.super_LineCol.offset = auVar4._0_8_;
    LVar5.super_LineCol.line = auVar4._8_8_;
    LVar5.super_LineCol.col = auVar4._16_8_;
    LVar5.name.str._4_4_ = cVar21.str._4_4_;
    LVar5.name.len = local_70;
    (*p_Var1)(msg,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
    uVar16 = this->m_state->flags;
  }
  if ((uVar16 & 0x10) != 0) {
    builtin_strncpy(msg,"check failed: (has_none(FLOW))",0x1e);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar2 = (code *)swi(3);
      uVar11 = (*pcVar2)();
      return (bool)uVar11;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar21 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_98 = cVar21.len;
    auVar4 = ZEXT1224(ZEXT412(0x6e2f) << 0x40);
    LVar6.name.str._0_4_ = (int)cVar21.str;
    LVar6.super_LineCol.offset = auVar4._0_8_;
    LVar6.super_LineCol.line = auVar4._8_8_;
    LVar6.super_LineCol.col = auVar4._16_8_;
    LVar6.name.str._4_4_ = cVar21.str._4_4_;
    LVar6.name.len = local_98;
    (*p_Var1)(msg,0x1f,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((local_198.len != 0) && (*local_198.str == '#')) {
    _scan_comment(this);
    return true;
  }
  uVar16 = this->m_state->flags;
  cVar12 = (char)uVar16;
  if ((uVar16 >> 8 & 1) != 0) {
    if (cVar12 < '\0') {
      builtin_strncpy(msg,"check failed: (has_none(RVAL))",0x1e);
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar2 = (code *)swi(3);
        uVar11 = (*pcVar2)();
        return (bool)uVar11;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar21 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_c0 = cVar21.len;
      auVar4 = ZEXT1224(ZEXT412(0x6e39) << 0x40);
      LVar7.name.str._0_4_ = (int)cVar21.str;
      LVar7.super_LineCol.offset = auVar4._0_8_;
      LVar7.super_LineCol.line = auVar4._8_8_;
      LVar7.super_LineCol.col = auVar4._16_8_;
      LVar7.name.str._4_4_ = cVar21.str._4_4_;
      LVar7.name.len = local_c0;
      (*p_Var1)(msg,0x1f,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar10 = _handle_indentation(this);
    if (bVar10) {
      return true;
    }
    pattern.len = 2;
    pattern.str = "- ";
    bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern);
    if (!bVar10) {
      iVar13 = basic_substring<const_char>::compare(&local_198,'-');
      if (iVar13 != 0) {
        chars.len = 2;
        chars.str = " \t";
        bVar10 = basic_substring<const_char>::begins_with_any(&local_198,chars);
        if (!bVar10) {
          pattern_02.len = 3;
          pattern_02.str = "...";
          bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern_02);
          if (bVar10) {
            _end_stream(this);
            sStackY_1d0 = 3;
            goto LAB_001c150e;
          }
          pattern_03.len = 3;
          pattern_03.str = "---";
          bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern_03);
          if (bVar10) {
            cVar21.len = local_198.len;
            cVar21.str = local_198.str;
            _start_new_doc(this,cVar21);
            return true;
          }
          bVar10 = is_debugger_attached();
          if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar2 = (code *)swi(3);
            uVar11 = (*pcVar2)();
            return (bool)uVar11;
          }
          goto LAB_001c16ba;
        }
        pSVar15 = this->m_state;
        if ((pSVar15->line_contents).rem.str == (pSVar15->line_contents).full.str) {
          builtin_strncpy(msg,"check failed: (! _at_line_begi",0x1e);
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar2 = (code *)swi(3);
            uVar11 = (*pcVar2)();
            return (bool)uVar11;
          }
          p_Var1 = (this->m_stack).m_callbacks.m_error;
          cVar21 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_e8 = cVar21.len;
          auVar4 = ZEXT1224(ZEXT412(0x6e4e) << 0x40);
          LVar8.name.str._0_4_ = (int)cVar21.str;
          LVar8.super_LineCol.offset = auVar4._0_8_;
          LVar8.super_LineCol.line = auVar4._8_8_;
          LVar8.super_LineCol.col = auVar4._16_8_;
          LVar8.name.str._4_4_ = cVar21.str._4_4_;
          LVar8.name.len = local_e8;
          (*p_Var1)(msg,0x23,LVar8,(this->m_stack).m_callbacks.m_user_data);
          pSVar15 = this->m_state;
        }
        chars_00.len = 2;
        chars_00.str = " \t";
        bVar10 = basic_substring<const_char>::begins_with_any
                           (&(pSVar15->line_contents).rem,chars_00);
        if (!bVar10) {
          pcVar18 = "check failed: (m_state->line_contents.rem.begins_with_any(chars))";
          pcVar19 = msg;
          for (lVar17 = 0x42; lVar17 != 0; lVar17 = lVar17 + -1) {
            *pcVar19 = *pcVar18;
            pcVar18 = pcVar18 + (ulong)bVar20 * -2 + 1;
            pcVar19 = pcVar19 + (ulong)bVar20 * -2 + 1;
          }
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar2 = (code *)swi(3);
            uVar11 = (*pcVar2)();
            return (bool)uVar11;
          }
          p_Var1 = (this->m_stack).m_callbacks.m_error;
          s.str = (char *)0x0;
          s.len = 0x6d71;
          cVar21 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_118 = cVar21.len;
          LVar9.super_LineCol.line._0_4_ = (int)s.len;
          LVar9.super_LineCol.offset = (size_t)s.str;
          LVar9.super_LineCol.line._4_4_ = (int)(s.len >> 0x20);
          LVar9.super_LineCol.col = 0;
          LVar9.name.str._0_4_ = (int)cVar21.str;
          LVar9.name.str._4_4_ = cVar21.str._4_4_;
          LVar9.name.len = local_118;
          (*p_Var1)(msg,0x42,LVar9,(this->m_stack).m_callbacks.m_user_data);
        }
        chars_01.len = 2;
        chars_01.str = " \t";
        sStackY_1d0 = basic_substring<const_char>::first_not_of
                                (&(this->m_state->line_contents).rem,chars_01,0);
        if (sStackY_1d0 == 0xffffffffffffffff) {
          sStackY_1d0 = (this->m_state->line_contents).rem.len;
        }
        goto LAB_001c150e;
      }
      pSVar15 = this->m_state;
      uVar16 = 0xfffffe7f;
      goto LAB_001c14fe;
    }
    this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x80;
LAB_001c112b:
    sStackY_1d0 = 2;
    goto LAB_001c150e;
  }
  if (-1 < cVar12) {
    return false;
  }
  bVar10 = _handle_indentation(this);
  if (bVar10) {
    return true;
  }
  s.str = (char *)0x0;
  s.len = 0;
  bVar10 = _scan_scalar_seq_blck(this,&s,&is_quoted);
  if (bVar10) {
    local_198.str = (this->m_state->line_contents).rem.str;
    local_198.len = (this->m_state->line_contents).rem.len;
    if (local_198.len == 0) {
LAB_001c1208:
      pattern_00.len = 2;
      pattern_00.str = ": ";
      bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern_00);
      if (!bVar10) {
LAB_001c154b:
        val.len = s.len;
        val.str = s.str;
        _append_val(this,val,(uint)is_quoted);
        this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
        return true;
      }
    }
    else {
      cVar12 = *local_198.str;
      if (cVar12 == ' ') {
        sVar14 = basic_substring<const_char>::first_not_of(&local_198,' ',0);
        if (sVar14 == 0xffffffffffffffff) {
          sVar14 = local_198.len;
        }
        _line_progressed(this,sVar14);
        if (local_198.len < sVar14) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar2 = (code *)swi(3);
            uVar11 = (*pcVar2)();
            return (bool)uVar11;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,local_198.str + sVar14,local_198.len - sVar14)
        ;
        local_198.len = CONCAT17(msg[0xf],CONCAT16(msg[0xe],CONCAT24(msg._12_2_,msg._8_4_)));
        local_198.str = (char *)msg._0_8_;
        if (local_198.len == 0) goto LAB_001c1208;
        cVar12 = *(char *)msg._0_8_;
      }
      if (cVar12 == '#') goto LAB_001c154b;
      if (local_198.str[local_198.len - 1] != ':') goto LAB_001c1208;
    }
    if (((this->m_key_anchor).len == 0) || ((this->m_key_anchor).str == (char *)0x0)) {
      _move_val_anchor_to_key_anchor(this);
    }
    if (((this->m_key_tag).len == 0) || ((this->m_key_tag).str == (char *)0x0)) {
      _move_val_tag_to_key_tag(this);
    }
    this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
    _push_level(this,false);
    _start_map(this,true);
    s_00.len = s.len;
    s_00.str = s.str;
    _store_scalar(this,s_00,(uint)is_quoted);
    bVar10 = _maybe_set_indentation_from_anchor_or_tag(this);
    if (!bVar10) {
      this->m_state->indref = this->m_state->scalar_col;
    }
    _move_key_tag2_to_key_tag(this);
    pSVar15 = this->m_state;
    uVar16 = 0xffffff3f;
LAB_001c14fe:
    uVar16 = uVar16 & pSVar15->flags | 0x80;
LAB_001c1506:
    pSVar15->flags = uVar16;
  }
  else {
    pattern_01.len = 2;
    pattern_01.str = "- ";
    bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern_01);
    if (bVar10) {
      bVar10 = _rval_dash_start_or_continue_seq(this);
      if (!bVar10) {
        return true;
      }
      goto LAB_001c112b;
    }
    iVar13 = basic_substring<const_char>::compare(&local_198,'-');
    if (iVar13 != 0) {
      if (local_198.len != 0) {
        if (*local_198.str == '{') {
          this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
          _push_level(this,true);
          _start_map(this,true);
          pSVar15 = this->m_state;
          uVar16 = pSVar15->flags & 0xffffff2fU | 0x50;
          goto LAB_001c1506;
        }
        if (*local_198.str == '[') {
          this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
          _push_level(this,true);
          _start_seq(this,true);
          this->m_state->flags = this->m_state->flags | 0x10;
          goto LAB_001c1508;
        }
      }
      pattern_04.len = 2;
      pattern_04.str = "? ";
      bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern_04);
      if (bVar10) {
        this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
        _push_level(this,false);
        _start_map(this,true);
        this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x60;
        _save_indentation(this,0);
        goto LAB_001c112b;
      }
      if ((local_198.len != 0) && (*local_198.str == ' ')) {
        sVar14 = basic_substring<const_char>::first_not_of(&local_198,' ',0);
        if ((sVar14 != 0xffffffffffffffff) && (local_198.len < sVar14)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar2 = (code *)swi(3);
            uVar11 = (*pcVar2)();
            return (bool)uVar11;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar14 == 0xffffffffffffffff) {
          msg._0_8_ = local_198.str;
          msg._8_4_ = (undefined4)local_198.len;
          msg._12_2_ = (undefined2)(local_198.len >> 0x20);
          msg[0xe] = (char)(local_198.len >> 0x30);
          msg[0xf] = (char)(local_198.len >> 0x38);
        }
        else {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)msg,local_198.str,sVar14);
        }
        sStackY_1d0 = CONCAT17(msg[0xf],CONCAT16(msg[0xe],CONCAT24(msg._12_2_,msg._8_4_)));
        goto LAB_001c150e;
      }
      bVar10 = _handle_types(this);
      if (bVar10) {
        return true;
      }
      bVar10 = _handle_val_anchors_and_refs(this);
      if (bVar10) {
        return true;
      }
      if (((uint)this->m_state->flags >> 9 & 1) != 0) {
LAB_001c1869:
        bVar10 = is_debugger_attached();
        if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar2 = (code *)swi(3);
          uVar11 = (*pcVar2)();
          return (bool)uVar11;
        }
LAB_001c16ba:
        fmt.len = 0x12;
        fmt.str = "ERROR: parse error";
        _err<>(this,fmt);
        return false;
      }
      pattern_05.len = 2;
      pattern_05.str = ": ";
      bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern_05);
      if (!bVar10) {
        pattern_06.len = 1;
        pattern_06.str = "#";
        sVar14 = basic_substring<const_char>::find(&local_198,pattern_06,0);
        if ((sVar14 != 0xffffffffffffffff) && (local_198.len < sVar14)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar2 = (code *)swi(3);
            uVar11 = (*pcVar2)();
            return (bool)uVar11;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar14 == 0xffffffffffffffff) {
          msg._0_8_ = local_198.str;
          msg._8_4_ = (undefined4)local_198.len;
          msg._12_2_ = (undefined2)(local_198.len >> 0x20);
          msg[0xe] = (char)(local_198.len >> 0x30);
          msg[0xf] = (char)(local_198.len >> 0x38);
        }
        else {
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)msg,local_198.str,sVar14);
        }
        local_40.len = CONCAT17(msg[0xf],CONCAT16(msg[0xe],CONCAT24(msg._12_2_,msg._8_4_)));
        local_40.str = (char *)msg._0_8_;
        chars_02.len = 1;
        chars_02.str = "\t";
        local_30 = basic_substring<const_char>::trimr(&local_40,chars_02);
        iVar13 = basic_substring<const_char>::compare(&local_30,":",1);
        if (iVar13 != 0) goto LAB_001c1869;
      }
      if ((((this->m_val_anchor).len == 0) || ((this->m_val_anchor).str == (char *)0x0)) &&
         (((this->m_val_tag).len == 0 || ((this->m_val_tag).str == (char *)0x0)))) {
        pSVar15 = this->m_state;
        pSVar15->flags = pSVar15->flags & 0xfffffe7fU | 0x100;
        sVar14 = pSVar15->indref;
        _push_level(this,false);
        _start_map(this,true);
        _store_scalar_null(this,local_198.str);
        pSVar15 = this->m_state;
        pSVar15->flags = pSVar15->flags & 0xffffff3fU | 0x80;
        pSVar15->indref = sVar14 + 2;
      }
      else {
        this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
        _move_val_tag_to_key_tag(this);
        _move_val_anchor_to_key_anchor(this);
        _push_level(this,false);
        _start_map(this,true);
        _store_scalar_null(this,local_198.str);
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
        bVar10 = _maybe_set_indentation_from_anchor_or_tag(this);
        if (!bVar10) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
            pcVar2 = (code *)swi(3);
            uVar11 = (*pcVar2)();
            return (bool)uVar11;
          }
          cVar21 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x13;
          msg[9] = 'n';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg._24_4_ = cVar21.str._0_4_;
          msg._28_2_ = cVar21.str._4_2_;
          (*(code *)PTR_error_impl_00231548)
                    ("check failed: _maybe_set_indentation_from_anchor_or_tag()",0x39,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      pattern_07.len = 2;
      pattern_07.str = ": ";
      bVar10 = basic_substring<const_char>::begins_with(&local_198,pattern_07);
      sStackY_1d0 = (ulong)bVar10 + 1;
      goto LAB_001c150e;
    }
    bVar10 = _rval_dash_start_or_continue_seq(this);
    if (!bVar10) {
      return true;
    }
  }
LAB_001c1508:
  sStackY_1d0 = 1;
LAB_001c150e:
  _line_progressed(this,sStackY_1d0);
  return true;
}

Assistant:

bool Parser::_handle_seq_blck()
{
    _c4dbgpf("handle_seq_impl: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }
    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        if(_handle_indentation())
            return true;

        if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("expect another val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
            _skipchars(" \t");
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("got document start '---'");
            _start_new_doc(rem);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        // there can be empty values
        if(_handle_indentation())
            return true;

        csubstr s;
        bool is_quoted;
        if(_scan_scalar_seq_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;
            if(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(rem.begins_with_any(" \t"), rem.begins_with(' ')))
            {
                _c4dbgp("skipping whitespace...");
                size_t skip = rem.first_not_of(_RYML_WITH_OR_WITHOUT_TAB_TOKENS(" \t", ' '));
                if(skip == csubstr::npos)
                    skip = rem.len; // maybe the line is just whitespace
                _line_progressed(skip);
                rem = rem.sub(skip);
            }

            _c4dbgpf("rem=[{}]~~~{}~~~", rem.len, rem);
            if(!rem.begins_with('#') && (rem.ends_with(':') || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t"))))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                if(m_key_anchor.empty())
                    _move_val_anchor_to_key_anchor();
                if(m_key_tag.empty())
                    _move_val_tag_to_key_tag();
                addrem_flags(RNXT, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _start_map();
                _store_scalar(s, is_quoted);
                if( ! _maybe_set_indentation_from_anchor_or_tag())
                {
                    _c4dbgpf("set indentation from scalar: {}", m_state->scalar_col);
                    _set_indentation(m_state->scalar_col); // this is the column where the scalar starts
                }
                _move_key_tag2_to_key_tag();
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending val to current seq");
                _append_val(s, is_quoted);
                addrem_flags(RNXT, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            if(_rval_dash_start_or_continue_seq())
                _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgp("val is a child map + this key is complex");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level();
            _start_map();
            addrem_flags(QMRK|RKEY, RVAL);
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        /* pathological case:
         * - &key : val
         * - &key :
         * - : val
         */
        else if((!has_all(SSCL)) &&
                (rem.begins_with(": ") || rem.left_of(rem.find("#")).trimr("\t") == ":"))
        {
            if(!m_val_anchor.empty() || !m_val_tag.empty())
            {
                _c4dbgp("val is a child map + this key is empty, with anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                _move_val_tag_to_key_tag();
                _move_val_anchor_to_key_anchor();
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                RYML_CHECK(_maybe_set_indentation_from_anchor_or_tag()); // one of them must exist
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
            else
            {
                _c4dbgp("val is a child map + this key is empty, no anchors or tags");
                addrem_flags(RNXT, RVAL); // before _push_level!
                size_t ind = m_state->indref;
                _push_level();
                _start_map();
                _store_scalar_null(rem.str);
                addrem_flags(RVAL, RKEY);
                _c4dbgpf("set indentation from map anchor: {}", ind + 2);
                _set_indentation(ind + 2); // this is the column where the map starts
                _line_progressed(rem.begins_with(": ") ? 2u : 1u);
                return true;
            }
        }
        else
        {
            _c4err("parse error");
        }
    }

    return false;
}